

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeData(BtCursor *pCur,u32 offset,u32 amt,void *pBuf)

{
  int iVar1;
  
  if (pCur->eState == 0) {
    return 4;
  }
  if ((2 < pCur->eState) && (iVar1 = btreeRestoreCursorPosition(pCur), iVar1 != 0)) {
    return iVar1;
  }
  iVar1 = accessPayload(pCur,offset,amt,(uchar *)pBuf,0);
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeData(BtCursor *pCur, u32 offset, u32 amt, void *pBuf){
  int rc;

#ifndef SQLITE_OMIT_INCRBLOB
  if ( pCur->eState==CURSOR_INVALID ){
    return SQLITE_ABORT;
  }
#endif

  assert( cursorHoldsMutex(pCur) );
  rc = restoreCursorPosition(pCur);
  if( rc==SQLITE_OK ){
    assert( pCur->eState==CURSOR_VALID );
    assert( pCur->iPage>=0 && pCur->apPage[pCur->iPage] );
    assert( pCur->aiIdx[pCur->iPage]<pCur->apPage[pCur->iPage]->nCell );
    rc = accessPayload(pCur, offset, amt, pBuf, 0);
  }
  return rc;
}